

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_type_names_do_all(EVP_PKEY *pkey,_func_void_char_ptr_void_ptr *fn,void *data)

{
  int n;
  char *pcVar1;
  _func_void_char_ptr_void_ptr *in_RDX;
  EVP_KEYMGMT *in_RSI;
  EVP_PKEY *in_RDI;
  char *name;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDI->type == 0) && (in_RDI->keymgmt == (EVP_KEYMGMT *)0x0)) {
    local_4 = 0;
  }
  else if (in_RDI->keymgmt == (EVP_KEYMGMT *)0x0) {
    n = EVP_PKEY_get_id(in_RDI);
    pcVar1 = OBJ_nid2sn(n);
    (*(code *)in_RSI)(pcVar1,in_RDX);
    local_4 = 1;
  }
  else {
    local_4 = EVP_KEYMGMT_names_do_all(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_type_names_do_all(const EVP_PKEY *pkey,
                               void (*fn)(const char *name, void *data),
                               void *data)
{
    if (!evp_pkey_is_typed(pkey))
        return 0;

    if (!evp_pkey_is_provided(pkey)) {
        const char *name = OBJ_nid2sn(EVP_PKEY_get_id(pkey));

        fn(name, data);
        return 1;
    }
    return EVP_KEYMGMT_names_do_all(pkey->keymgmt, fn, data);
}